

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict
sexp_get_opcode_ret_type(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  undefined8 uVar1;
  sexp_conflict psVar2;
  sexp type;
  
  if (op == (sexp_conflict)0x0) {
    return (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
  }
  if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
    if ((op->value).flonum_bits[0x59] == '\x01') {
      uVar1 = sexp_intern(ctx,"error",0xffffffffffffffff);
      psVar2 = (sexp_conflict)sexp_cons_op(ctx,0,2,uVar1,0x23e);
      return psVar2;
    }
    type = (op->value).type.setters;
    if (((ulong)type & 1) != 0) {
      type = *(sexp *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                      ((ulong)type & 0xfffffffffffffffe) * 4 + 8);
    }
    psVar2 = sexp_translate_opcode_type(ctx,type);
    return psVar2;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x1b);
  return psVar2;
}

Assistant:

sexp sexp_get_opcode_ret_type (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  sexp res;
  if (!op)
    return sexp_type_by_index(ctx, SEXP_OBJECT);
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  if (sexp_opcode_code(op) == SEXP_OP_RAISE)
    return sexp_list1(ctx, sexp_intern(ctx, "error", -1));
  res = sexp_opcode_return_type(op);
  if (sexp_fixnump(res))
    res = sexp_type_by_index(ctx, sexp_unbox_fixnum(res));
  return sexp_translate_opcode_type(ctx, res);
}